

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall BBDT<TTA>::FirstScan(BBDT<TTA> *this)

{
  char cVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int r;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar9 = (long)*(int *)&pMVar2->field_0x8;
  lVar18 = (long)*(int *)&pMVar2->field_0xc;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar15 = 0;
  do {
    if (lVar9 <= (long)uVar15) {
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar11 = **(long **)&pMVar2->field_0x48;
    lVar13 = lVar11 * uVar15 + *(long *)&pMVar2->field_0x10;
    lVar12 = lVar13 - lVar11;
    lVar5 = lVar12 - lVar11;
    lVar10 = **(long **)&pMVar3->field_0x48;
    lVar16 = lVar10 * uVar15 + *(long *)&pMVar3->field_0x10;
    lVar11 = lVar11 + lVar13;
    lVar10 = lVar16 + lVar10 * -2;
    uVar6 = uVar15 | 1;
    for (uVar17 = 0; (long)uVar17 < lVar18; uVar17 = uVar17 + 2) {
      lVar8 = lVar10;
      if (*(char *)(lVar13 + uVar17) == '\0') {
        if (((long)uVar6 < lVar9) && (*(char *)(lVar11 + uVar17) != '\0')) {
          uVar7 = uVar17 | 1;
          if ((lVar18 <= (long)uVar7) || (*(char *)(lVar13 + uVar7) == '\0')) {
            if ((uVar17 != 0) &&
               ((*(char *)((uVar17 - 1) + lVar11) != '\0' ||
                (*(char *)(lVar13 + -1 + uVar17) != '\0')))) goto LAB_0018e2b9;
            goto LAB_0018e210;
          }
          if (uVar17 == 0) {
LAB_0018ded0:
            if (uVar15 == 0) goto LAB_0018e210;
            if (*(char *)(lVar12 + (uVar17 | 1)) == '\0') {
              if (((long)(uVar17 + 2) < lVar18) && (*(char *)(lVar12 + uVar17 + 2) != '\0')) {
                if (*(char *)(lVar12 + uVar17) == '\0') goto LAB_0018e28a;
                goto LAB_0018e0a7;
              }
              if (*(char *)(lVar12 + uVar17) == '\0') goto LAB_0018e210;
            }
            goto LAB_0018e207;
          }
          if (*(char *)((uVar17 - 1) + lVar13) == '\0') {
            if (*(char *)(lVar11 + -1 + uVar17) == '\0') goto LAB_0018ded0;
            if (uVar15 != 0) {
              if (*(char *)(lVar12 + uVar7) != '\0') {
                if (*(char *)((uVar17 - 2) + lVar13) == '\0') goto LAB_0018e2d3;
                if (*(char *)(lVar12 + -1 + uVar17) == '\0') {
                  cVar1 = *(char *)(lVar12 + -2 + uVar17);
                  goto joined_r0x0018e3e6;
                }
                if (*(char *)(lVar12 + uVar17) != '\0') goto LAB_0018e2b9;
                goto LAB_0018e007;
              }
              if (((long)(uVar17 + 2) < lVar18) && (*(char *)(lVar12 + uVar17 + 2) != '\0')) {
                if (*(char *)(lVar5 + uVar7) == '\0') {
                  if (*(char *)(lVar12 + uVar17) != '\0') {
                    if (*(char *)((uVar17 - 2) + lVar13) == '\0') goto LAB_0018e463;
                    if (*(char *)(lVar12 + -1 + uVar17) == '\0') goto LAB_0018e422;
                  }
                }
                else if (*(char *)((uVar17 - 2) + lVar13) != '\0') {
                  if (*(char *)(lVar12 + -1 + uVar17) == '\0') {
                    cVar1 = *(char *)(lVar12 + -2 + uVar17);
                    goto joined_r0x0018e354;
                  }
                  goto LAB_0018e3c3;
                }
                goto LAB_0018e44b;
              }
              if (*(char *)(lVar12 + uVar17) != '\0') {
                if (*(char *)((uVar17 - 2) + lVar13) == '\0') goto LAB_0018e2d3;
                if (*(char *)(lVar12 + -1 + uVar17) == '\0') goto LAB_0018e2a4;
              }
            }
          }
          else if (uVar15 != 0) {
            if (*(char *)(lVar12 + uVar7) == '\0') goto LAB_0018df27;
            goto LAB_0018de24;
          }
LAB_0018e2b9:
          uVar4 = *(uint *)(lVar16 + -8 + uVar17 * 4);
          goto LAB_0018e2be;
        }
        uVar7 = uVar17 | 1;
        if ((long)uVar7 < lVar18) {
          if (*(char *)(lVar13 + uVar7) != '\0') goto LAB_0018ded0;
          if (((long)uVar6 < lVar9) && (*(char *)(lVar11 + uVar7) != '\0')) goto LAB_0018e210;
        }
        *(undefined4 *)(lVar16 + uVar17 * 4) = 0;
      }
      else {
        if (uVar17 == 0) {
LAB_0018e017:
          uVar7 = uVar17 | 1;
          if ((uVar15 == 0) || ((lVar18 <= (long)uVar7 || (*(char *)(lVar12 + uVar7) == '\0')))) {
            if (((long)uVar7 < lVar18) && (*(char *)(lVar13 + uVar7) != '\0')) {
              if ((uVar15 == 0) || (lVar18 <= (long)(uVar17 + 2))) {
                if (uVar15 == 0) goto LAB_0018e210;
              }
              else if (*(char *)(lVar12 + uVar17 + 2) != '\0') {
                if (*(char *)(lVar12 + uVar17) == '\0') {
                  if (((uVar17 == 0) || (*(char *)(lVar12 + -1 + uVar17) == '\0')) ||
                     ((*(char *)(lVar5 + uVar7) != '\0' && (*(char *)(lVar5 + uVar17) != '\0'))))
                  goto LAB_0018e28a;
                  uVar4 = *(uint *)(lVar10 + -8 + uVar17 * 4);
                }
                else {
LAB_0018e0a7:
                  if (*(char *)(lVar5 + (uVar17 | 1)) != '\0') {
LAB_0018e28a:
                    uVar4 = *(uint *)(lVar10 + 8 + uVar17 * 4);
                    goto LAB_0018e2be;
                  }
                  uVar4 = *(uint *)(lVar10 + uVar17 * 4);
                }
                uVar14 = *(uint *)(lVar10 + 8 + uVar17 * 4);
                goto LAB_0018e459;
              }
              if (*(char *)(lVar12 + uVar17) != '\0') {
LAB_0018e207:
                uVar4 = *(uint *)(lVar8 + uVar17 * 4);
                goto LAB_0018e2be;
              }
              if (uVar15 != 0 && uVar17 != 0) {
LAB_0018e15a:
                lVar8 = lVar10 + -8;
                if (*(char *)(lVar12 + -1 + uVar17) != '\0') goto LAB_0018e207;
              }
            }
            else if (uVar15 != 0) {
              if (*(char *)(lVar12 + uVar17) != '\0') goto LAB_0018e207;
              if (uVar17 != 0) goto LAB_0018e15a;
            }
LAB_0018e210:
            uVar4 = TTA::NewLabel();
            goto LAB_0018e2be;
          }
          if ((((*(char *)(lVar12 + uVar17) != '\0') || (uVar17 == 0)) ||
              (*(char *)(lVar12 + -1 + uVar17) == '\0')) || (*(char *)(lVar5 + uVar17) != '\0'))
          goto LAB_0018e207;
          uVar4 = *(uint *)(lVar10 + -8 + uVar17 * 4);
          uVar14 = *(uint *)(lVar10 + uVar17 * 4);
        }
        else {
          if (*(char *)(lVar13 + -1 + uVar17) != '\0') {
            uVar7 = uVar17 | 1;
            if (((uVar15 == 0) || (lVar18 <= (long)uVar7)) || (*(char *)(lVar12 + uVar7) == '\0')) {
              if ((((long)uVar7 < lVar18) && (*(char *)(lVar13 + uVar7) != '\0')) && (uVar15 != 0))
              {
LAB_0018df27:
                if ((((long)(uVar17 + 2) < lVar18) && (*(char *)(lVar12 + uVar17 + 2) != '\0')) &&
                   ((*(char *)(lVar5 + (uVar17 | 1)) == '\0' ||
                    ((*(char *)(lVar12 + uVar17) == '\0' &&
                     ((*(char *)(lVar5 + uVar17) == '\0' ||
                      ((*(char *)(lVar12 + -1 + uVar17) == '\0' &&
                       ((*(char *)((uVar17 - 2) + lVar12) == '\0' ||
                        (*(char *)(lVar5 + -1 + uVar17) == '\0')))))))))))) goto LAB_0018e44b;
              }
            }
            else {
LAB_0018de24:
              if (*(char *)(lVar12 + uVar17) == '\0') {
                if (*(char *)(lVar5 + uVar17) != '\0') {
                  if (*(char *)(lVar12 + -1 + uVar17) != '\0') goto LAB_0018e2b9;
                  cVar1 = *(char *)((uVar17 - 2) + lVar12);
joined_r0x0018de51:
                  if (cVar1 != '\0') {
                    cVar1 = *(char *)(lVar5 + -1 + uVar17);
                    goto joined_r0x0018e2b7;
                  }
                }
LAB_0018e2d3:
                uVar4 = *(uint *)(lVar10 + uVar17 * 4);
                goto LAB_0018e454;
              }
            }
            goto LAB_0018e2b9;
          }
          if ((lVar9 <= (long)uVar6) || (*(char *)(lVar11 + -1 + uVar17) == '\0'))
          goto LAB_0018e017;
          uVar7 = uVar17 | 1;
          if (((uVar15 == 0) || (lVar18 <= (long)uVar7)) || (*(char *)(lVar12 + uVar7) == '\0')) {
            if (((lVar18 <= (long)uVar7) || (*(char *)(lVar13 + uVar7) == '\0')) ||
               ((uVar15 == 0 ||
                ((lVar18 <= (long)(uVar17 + 2) || (*(char *)(lVar12 + uVar17 + 2) == '\0')))))) {
              if (uVar15 != 0) {
                if (*(char *)(lVar12 + -1 + uVar17) == '\0') {
                  if (*(char *)(lVar12 + uVar17) != '\0') {
                    if (*(char *)((uVar17 - 2) + lVar13) != '\0') {
LAB_0018e2a4:
                      cVar1 = *(char *)(lVar12 + -2 + uVar17);
                      goto joined_r0x0018de51;
                    }
                    goto LAB_0018e2d3;
                  }
                }
                else if (*(char *)((uVar17 - 2) + lVar13) == '\0') {
                  uVar4 = *(uint *)(lVar10 + -8 + uVar17 * 4);
                  goto LAB_0018e454;
                }
              }
              goto LAB_0018e2b9;
            }
            if (*(char *)((uVar17 - 2) + lVar13) == '\0') {
              if (*(char *)(lVar12 + uVar17) == '\0') {
                if ((*(char *)(lVar12 + -1 + uVar17) != '\0') &&
                   ((*(char *)(lVar5 + uVar7) == '\0' || (*(char *)(lVar5 + uVar17) == '\0')))) {
                  uVar4 = *(uint *)(lVar10 + -8 + uVar17 * 4);
                  goto LAB_0018e46b;
                }
              }
              else {
                cVar1 = *(char *)(lVar5 + uVar7);
joined_r0x0018e36f:
                if (cVar1 == '\0') {
LAB_0018e463:
                  uVar4 = *(uint *)(lVar10 + uVar17 * 4);
LAB_0018e46b:
                  uVar14 = *(uint *)(lVar10 + 8 + uVar17 * 4);
                  goto LAB_0018e470;
                }
              }
            }
            else if (*(char *)(lVar12 + -1 + uVar17) == '\0') {
              if (*(char *)(lVar5 + uVar7) == '\0') {
                if (*(char *)(lVar12 + uVar17) != '\0') {
LAB_0018e422:
                  if (*(char *)(lVar12 + -2 + uVar17) != '\0') {
                    cVar1 = *(char *)(lVar5 + -1 + uVar17);
                    goto joined_r0x0018e36f;
                  }
                  goto LAB_0018e463;
                }
              }
              else {
                cVar1 = *(char *)(lVar12 + -2 + uVar17);
joined_r0x0018e354:
                if ((cVar1 != '\0') && (*(char *)(lVar5 + -1 + uVar17) != '\0')) {
LAB_0018e3c3:
                  cVar1 = *(char *)(lVar12 + uVar17);
                  goto joined_r0x0018e3c8;
                }
              }
            }
            else if (*(char *)(lVar5 + uVar7) != '\0') {
              cVar1 = *(char *)(lVar12 + uVar17);
joined_r0x0018e3c8:
              if ((cVar1 != '\0') || (*(char *)(lVar5 + uVar17) != '\0')) goto LAB_0018e2b9;
            }
LAB_0018e44b:
            uVar4 = *(uint *)(lVar10 + 8 + uVar17 * 4);
LAB_0018e454:
            uVar14 = *(uint *)(lVar16 + -8 + uVar17 * 4);
          }
          else {
            if (*(char *)((uVar17 - 2) + lVar13) != '\0') {
              if (*(char *)(lVar12 + -1 + uVar17) == '\0') {
                cVar1 = *(char *)(lVar12 + -2 + uVar17);
joined_r0x0018e3e6:
                if ((cVar1 == '\0') || (*(char *)(lVar5 + -1 + uVar17) == '\0')) goto LAB_0018e2d3;
              }
              if (*(char *)(lVar12 + uVar17) == '\0') {
LAB_0018e007:
                cVar1 = *(char *)(lVar5 + uVar17);
joined_r0x0018e2b7:
                if (cVar1 == '\0') goto LAB_0018e2d3;
              }
              goto LAB_0018e2b9;
            }
            if (((*(char *)(lVar12 + uVar17) != '\0') || (*(char *)(lVar12 + -1 + uVar17) == '\0'))
               || (*(char *)(lVar5 + uVar17) != '\0')) goto LAB_0018e2d3;
            uVar4 = *(uint *)(lVar10 + -8 + uVar17 * 4);
            uVar14 = *(uint *)(lVar10 + uVar17 * 4);
LAB_0018e470:
            uVar4 = TTA::Merge(uVar4,uVar14);
            uVar14 = *(uint *)(lVar16 + -8 + uVar17 * 4);
          }
        }
LAB_0018e459:
        uVar4 = TTA::Merge(uVar4,uVar14);
LAB_0018e2be:
        *(uint *)(lVar16 + uVar17 * 4) = uVar4;
      }
    }
    uVar15 = uVar15 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }